

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugNodeFont(ImFont *font)

{
  bool bVar1;
  bool bVar2;
  float size;
  ImGuiIO *pIVar3;
  char *pcVar4;
  ImDrawList *draw_list_00;
  ImGuiStyle *pIVar5;
  ImFontGlyph *pIVar6;
  ImFont *in_RDI;
  float fVar7;
  float fVar8;
  float unaff_retaddr;
  ImDrawFlags unaff_retaddr_00;
  float in_stack_00000008;
  ImU32 in_stack_0000000c;
  ImVec2 *in_stack_00000010;
  ImVec2 *in_stack_00000018;
  ImFontGlyph *glyph;
  ImVec2 cell_p2;
  ImVec2 cell_p1;
  uint n_1;
  ImVec2 base_pos;
  uint n;
  int count;
  uint base;
  float cell_spacing;
  float cell_size;
  ImU32 glyph_col;
  ImDrawList *draw_list;
  ImFontConfig *cfg;
  int config_i;
  int surface_sqrt;
  char c_str [5];
  bool opened;
  ImFont *in_stack_ffffffffffffff78;
  ImFont *font_00;
  ImFont *pIVar9;
  float in_stack_ffffffffffffff90;
  float in_stack_ffffffffffffff94;
  float *in_stack_ffffffffffffff98;
  ImVec2 *in_stack_ffffffffffffffa0;
  ImVec2 local_54;
  uint local_4c;
  ImVec2 local_48;
  uint uVar10;
  uint col;
  uint c_begin;
  ImFontConfig *in_stack_ffffffffffffffe0;
  uint local_18;
  
  if (in_RDI->ConfigData == (ImFontConfig *)0x0) {
    font_00 = (ImFont *)0x2bc7ee;
  }
  else {
    font_00 = (ImFont *)in_RDI->ConfigData->Name;
  }
  pIVar9 = in_RDI;
  bVar1 = TreeNode((void *)(double)in_RDI->FontSize,(char *)in_RDI,
                   "Font: \"%s\"\n%.2f px, %d glyphs, %d file(s)",font_00,
                   (ulong)(uint)(in_RDI->Glyphs).Size,(ulong)(uint)(int)in_RDI->ConfigDataCount);
  SameLine(0.0,-1.0);
  bVar2 = SmallButton((char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  if (bVar2) {
    in_stack_ffffffffffffff78 = in_RDI;
    pIVar3 = GetIO();
    pIVar3->FontDefault = in_stack_ffffffffffffff78;
  }
  if (bVar1) {
    PushFont(font_00);
    Text("The quick brown fox jumps over the lazy dog");
    PopFont();
    fVar7 = GetFontSize();
    SetNextItemWidth(fVar7 * 8.0);
    DragFloat((char *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
              in_stack_ffffffffffffff90,(float)((ulong)pIVar9 >> 0x20),(char *)font_00,
              (ImGuiSliderFlags)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    SameLine(0.0,-1.0);
    MetricsHelpMarker((char *)0x203949);
    Text((char *)(double)in_RDI->Ascent,(double)in_RDI->Descent,
         (double)(in_RDI->Ascent - in_RDI->Descent),"Ascent: %f, Descent: %f, Height: %f");
    pcVar4 = ImTextCharToUtf8((char *)font_00,(uint)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    Text("Fallback character: \'%s\' (U+%04X)",pcVar4,(ulong)in_RDI->FallbackChar);
    pcVar4 = ImTextCharToUtf8((char *)font_00,(uint)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    Text("Ellipsis character: \'%s\' (U+%04X)",pcVar4,(ulong)in_RDI->EllipsisChar);
    fVar7 = sqrtf((float)in_RDI->MetricsTotalSurface);
    Text("Texture Area: about %d px ~%dx%d px",(ulong)(uint)in_RDI->MetricsTotalSurface,
         (ulong)(uint)(int)fVar7,(ulong)(uint)(int)fVar7);
    for (local_18 = 0; (int)local_18 < (int)in_RDI->ConfigDataCount; local_18 = local_18 + 1) {
      if ((in_RDI->ConfigData != (ImFontConfig *)0x0) &&
         (in_stack_ffffffffffffffe0 = in_RDI->ConfigData + (int)local_18,
         in_stack_ffffffffffffffe0 != (ImFontConfig *)0x0)) {
        BulletText((char *)(double)(in_stack_ffffffffffffffe0->GlyphOffset).x,
                   (double)(in_stack_ffffffffffffffe0->GlyphOffset).y,
                   "Input %d: \'%s\', Oversample: (%d,%d), PixelSnapH: %d, Offset: (%.1f,%.1f)",
                   (ulong)local_18,in_stack_ffffffffffffffe0->Name,
                   (ulong)(uint)in_stack_ffffffffffffffe0->OversampleH,
                   (ulong)(uint)in_stack_ffffffffffffffe0->OversampleV,
                   (ulong)(in_stack_ffffffffffffffe0->PixelSnapH & 1));
      }
    }
    bVar1 = TreeNode("Glyphs","Glyphs (%d)",(ulong)(uint)(in_RDI->Glyphs).Size);
    if (bVar1) {
      draw_list_00 = GetWindowDrawList();
      size = (float)GetColorU32((ImGuiCol)in_stack_ffffffffffffff94,in_stack_ffffffffffffff90);
      fVar8 = in_RDI->FontSize * 1.0;
      pIVar5 = GetStyle();
      fVar7 = (pIVar5->ItemSpacing).y;
      for (c_begin = 0; c_begin < 0x10000; c_begin = c_begin + 0x100) {
        if (((c_begin & 0xfff) == 0) &&
           (bVar1 = ImFont::IsGlyphRangeUnused(in_RDI,c_begin,c_begin + 0xfff), bVar1)) {
          c_begin = c_begin + 0xf00;
        }
        else {
          col = 0;
          for (uVar10 = 0; uVar10 < 0x100; uVar10 = uVar10 + 1) {
            pIVar6 = ImFont::FindGlyphNoFallback(in_RDI,(short)c_begin + (short)uVar10);
            if (pIVar6 != (ImFontGlyph *)0x0) {
              col = col + 1;
            }
          }
          if (0 < (int)col) {
            pcVar4 = "glyph";
            if (1 < (int)col) {
              pcVar4 = "glyphs";
            }
            bVar1 = TreeNode((void *)(ulong)c_begin,"U+%04X..U+%04X (%d %s)",(ulong)c_begin,
                             (ulong)(c_begin + 0xff),(ulong)col,pcVar4);
            if (bVar1) {
              local_48 = GetCursorScreenPos();
              for (local_4c = 0; local_4c < 0x100; local_4c = local_4c + 1) {
                ImVec2::ImVec2(&local_54,(float)(local_4c & 0xf) * (fVar8 + fVar7) + local_48.x,
                               (float)(local_4c >> 4) * (fVar8 + fVar7) + local_48.y);
                ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffa4,local_54.x + fVar8,
                               local_54.y + fVar8);
                pIVar6 = ImFont::FindGlyphNoFallback(in_RDI,(short)c_begin + (short)local_4c);
                ImDrawList::AddRect((ImDrawList *)glyph,in_stack_00000018,in_stack_00000010,
                                    in_stack_0000000c,in_stack_00000008,unaff_retaddr_00,
                                    unaff_retaddr);
                if (pIVar6 != (ImFontGlyph *)0x0) {
                  ImFont::RenderChar((ImFont *)in_stack_ffffffffffffffe0,draw_list_00,size,
                                     (ImVec2 *)CONCAT44(fVar7,c_begin),col,(ImWchar)(uVar10 >> 0x10)
                                    );
                  bVar1 = IsMouseHoveringRect((ImVec2 *)pIVar6,
                                              (ImVec2 *)
                                              CONCAT44(in_stack_ffffffffffffff94,
                                                       in_stack_ffffffffffffff90),
                                              SUB81((ulong)pIVar9 >> 0x38,0));
                  if ((bVar1) && (bVar1 = BeginTooltip(), bVar1)) {
                    DebugNodeFontGlyph(font_00,(ImFontGlyph *)in_stack_ffffffffffffff78);
                    EndTooltip();
                  }
                }
              }
              ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff90,(fVar8 + fVar7) * 16.0,
                             (fVar8 + fVar7) * 16.0);
              Dummy(in_stack_ffffffffffffffa0);
              TreePop();
            }
          }
        }
      }
      TreePop();
    }
    TreePop();
  }
  return;
}

Assistant:

void ImGui::DebugNodeFont(ImFont* font)
{
    bool opened = TreeNode(font, "Font: \"%s\"\n%.2f px, %d glyphs, %d file(s)",
        font->ConfigData ? font->ConfigData[0].Name : "", font->FontSize, font->Glyphs.Size, font->ConfigDataCount);
    SameLine();
    if (SmallButton("Set as default"))
        GetIO().FontDefault = font;
    if (!opened)
        return;

    // Display preview text
    PushFont(font);
    Text("The quick brown fox jumps over the lazy dog");
    PopFont();

    // Display details
    SetNextItemWidth(GetFontSize() * 8);
    DragFloat("Font scale", &font->Scale, 0.005f, 0.3f, 2.0f, "%.1f");
    SameLine(); MetricsHelpMarker(
        "Note that the default embedded font is NOT meant to be scaled.\n\n"
        "Font are currently rendered into bitmaps at a given size at the time of building the atlas. "
        "You may oversample them to get some flexibility with scaling. "
        "You can also render at multiple sizes and select which one to use at runtime.\n\n"
        "(Glimmer of hope: the atlas system will be rewritten in the future to make scaling more flexible.)");
    Text("Ascent: %f, Descent: %f, Height: %f", font->Ascent, font->Descent, font->Ascent - font->Descent);
    char c_str[5];
    Text("Fallback character: '%s' (U+%04X)", ImTextCharToUtf8(c_str, font->FallbackChar), font->FallbackChar);
    Text("Ellipsis character: '%s' (U+%04X)", ImTextCharToUtf8(c_str, font->EllipsisChar), font->EllipsisChar);
    const int surface_sqrt = (int)ImSqrt((float)font->MetricsTotalSurface);
    Text("Texture Area: about %d px ~%dx%d px", font->MetricsTotalSurface, surface_sqrt, surface_sqrt);
    for (int config_i = 0; config_i < font->ConfigDataCount; config_i++)
        if (font->ConfigData)
            if (const ImFontConfig* cfg = &font->ConfigData[config_i])
                BulletText("Input %d: \'%s\', Oversample: (%d,%d), PixelSnapH: %d, Offset: (%.1f,%.1f)",
                    config_i, cfg->Name, cfg->OversampleH, cfg->OversampleV, cfg->PixelSnapH, cfg->GlyphOffset.x, cfg->GlyphOffset.y);

    // Display all glyphs of the fonts in separate pages of 256 characters
    if (TreeNode("Glyphs", "Glyphs (%d)", font->Glyphs.Size))
    {
        ImDrawList* draw_list = GetWindowDrawList();
        const ImU32 glyph_col = GetColorU32(ImGuiCol_Text);
        const float cell_size = font->FontSize * 1;
        const float cell_spacing = GetStyle().ItemSpacing.y;
        for (unsigned int base = 0; base <= IM_UNICODE_CODEPOINT_MAX; base += 256)
        {
            // Skip ahead if a large bunch of glyphs are not present in the font (test in chunks of 4k)
            // This is only a small optimization to reduce the number of iterations when IM_UNICODE_MAX_CODEPOINT
            // is large // (if ImWchar==ImWchar32 we will do at least about 272 queries here)
            if (!(base & 4095) && font->IsGlyphRangeUnused(base, base + 4095))
            {
                base += 4096 - 256;
                continue;
            }

            int count = 0;
            for (unsigned int n = 0; n < 256; n++)
                if (font->FindGlyphNoFallback((ImWchar)(base + n)))
                    count++;
            if (count <= 0)
                continue;
            if (!TreeNode((void*)(intptr_t)base, "U+%04X..U+%04X (%d %s)", base, base + 255, count, count > 1 ? "glyphs" : "glyph"))
                continue;

            // Draw a 16x16 grid of glyphs
            ImVec2 base_pos = GetCursorScreenPos();
            for (unsigned int n = 0; n < 256; n++)
            {
                // We use ImFont::RenderChar as a shortcut because we don't have UTF-8 conversion functions
                // available here and thus cannot easily generate a zero-terminated UTF-8 encoded string.
                ImVec2 cell_p1(base_pos.x + (n % 16) * (cell_size + cell_spacing), base_pos.y + (n / 16) * (cell_size + cell_spacing));
                ImVec2 cell_p2(cell_p1.x + cell_size, cell_p1.y + cell_size);
                const ImFontGlyph* glyph = font->FindGlyphNoFallback((ImWchar)(base + n));
                draw_list->AddRect(cell_p1, cell_p2, glyph ? IM_COL32(255, 255, 255, 100) : IM_COL32(255, 255, 255, 50));
                if (!glyph)
                    continue;
                font->RenderChar(draw_list, cell_size, cell_p1, glyph_col, (ImWchar)(base + n));
                if (IsMouseHoveringRect(cell_p1, cell_p2) && BeginTooltip())
                {
                    DebugNodeFontGlyph(font, glyph);
                    EndTooltip();
                }
            }
            Dummy(ImVec2((cell_size + cell_spacing) * 16, (cell_size + cell_spacing) * 16));
            TreePop();
        }
        TreePop();
    }
    TreePop();
}